

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_scatter_with_6_coeffs_cont
               (float **outputs,float *vertical_coefficients,float *input,float *input_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float r;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c5;
  __m128 c4;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_db8;
  float c5s;
  float *output5;
  float *pfStack_da8;
  float c4s;
  float *output4;
  float *pfStack_d98;
  float c3s;
  float *output3;
  float *pfStack_d88;
  float c2s;
  float *output2;
  float *pfStack_d78;
  float c1s;
  float *output1;
  float *pfStack_d68;
  float c0s;
  float *output0;
  float *input_end_local;
  float *input_local;
  float *vertical_coefficients_local;
  float **outputs_local;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  
  pfStack_d68 = *outputs;
  fVar1 = *vertical_coefficients;
  pfStack_d78 = outputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_d88 = outputs[2];
  fVar3 = vertical_coefficients[2];
  pfStack_d98 = outputs[3];
  fVar4 = vertical_coefficients[3];
  pfStack_da8 = outputs[4];
  fVar5 = vertical_coefficients[4];
  pfStack_db8 = outputs[5];
  fVar6 = vertical_coefficients[5];
  for (input_end_local = input; 0x3f < (long)input_end - (long)input_end_local;
      input_end_local = input_end_local + 0x10) {
    local_4b8 = (float)*(undefined8 *)input_end_local;
    fStack_4b4 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_4b0 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_4ac = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    local_f8 = (float)*(undefined8 *)pfStack_d68;
    fStack_f4 = (float)((ulong)*(undefined8 *)pfStack_d68 >> 0x20);
    fStack_f0 = (float)*(undefined8 *)(pfStack_d68 + 2);
    fStack_ec = (float)((ulong)*(undefined8 *)(pfStack_d68 + 2) >> 0x20);
    o1[3] = fStack_f4 + fStack_4b4 * fVar1;
    o1[2] = local_f8 + local_4b8 * fVar1;
    o0[1] = fStack_ec + fStack_4ac * fVar1;
    o0[0] = fStack_f0 + fStack_4b0 * fVar1;
    local_4d8 = (float)*(undefined8 *)(input_end_local + 4);
    fStack_4d4 = (float)((ulong)*(undefined8 *)(input_end_local + 4) >> 0x20);
    fStack_4d0 = (float)*(undefined8 *)(input_end_local + 6);
    fStack_4cc = (float)((ulong)*(undefined8 *)(input_end_local + 6) >> 0x20);
    local_118 = (float)*(undefined8 *)(pfStack_d68 + 4);
    fStack_114 = (float)((ulong)*(undefined8 *)(pfStack_d68 + 4) >> 0x20);
    fStack_110 = (float)*(undefined8 *)(pfStack_d68 + 6);
    fStack_10c = (float)((ulong)*(undefined8 *)(pfStack_d68 + 6) >> 0x20);
    o2[3] = fStack_114 + fStack_4d4 * fVar1;
    o2[2] = local_118 + local_4d8 * fVar1;
    o1[1] = fStack_10c + fStack_4cc * fVar1;
    o1[0] = fStack_110 + fStack_4d0 * fVar1;
    local_4f8 = (float)*(undefined8 *)(input_end_local + 8);
    fStack_4f4 = (float)((ulong)*(undefined8 *)(input_end_local + 8) >> 0x20);
    fStack_4f0 = (float)*(undefined8 *)(input_end_local + 10);
    fStack_4ec = (float)((ulong)*(undefined8 *)(input_end_local + 10) >> 0x20);
    local_138 = (float)*(undefined8 *)(pfStack_d68 + 8);
    fStack_134 = (float)((ulong)*(undefined8 *)(pfStack_d68 + 8) >> 0x20);
    fStack_130 = (float)*(undefined8 *)(pfStack_d68 + 10);
    fStack_12c = (float)((ulong)*(undefined8 *)(pfStack_d68 + 10) >> 0x20);
    o3[3] = fStack_134 + fStack_4f4 * fVar1;
    o3[2] = local_138 + local_4f8 * fVar1;
    o2[1] = fStack_12c + fStack_4ec * fVar1;
    o2[0] = fStack_130 + fStack_4f0 * fVar1;
    local_518 = (float)*(undefined8 *)(input_end_local + 0xc);
    fStack_514 = (float)((ulong)*(undefined8 *)(input_end_local + 0xc) >> 0x20);
    fStack_510 = (float)*(undefined8 *)(input_end_local + 0xe);
    fStack_50c = (float)((ulong)*(undefined8 *)(input_end_local + 0xe) >> 0x20);
    local_158 = (float)*(undefined8 *)(pfStack_d68 + 0xc);
    fStack_154 = (float)((ulong)*(undefined8 *)(pfStack_d68 + 0xc) >> 0x20);
    fStack_150 = (float)*(undefined8 *)(pfStack_d68 + 0xe);
    fStack_14c = (float)((ulong)*(undefined8 *)(pfStack_d68 + 0xe) >> 0x20);
    r0[3] = fStack_154 + fStack_514 * fVar1;
    r0[2] = local_158 + local_518 * fVar1;
    o3[1] = fStack_14c + fStack_50c * fVar1;
    o3[0] = fStack_150 + fStack_510 * fVar1;
    *(undefined8 *)pfStack_d68 = o1._8_8_;
    *(undefined8 *)(pfStack_d68 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_d68 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_d68 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_d68 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_d68 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_d68 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_d68 + 0xe) = o3._0_8_;
    local_178 = (float)*(undefined8 *)pfStack_d78;
    fStack_174 = (float)((ulong)*(undefined8 *)pfStack_d78 >> 0x20);
    fStack_170 = (float)*(undefined8 *)(pfStack_d78 + 2);
    fStack_16c = (float)((ulong)*(undefined8 *)(pfStack_d78 + 2) >> 0x20);
    o1[3] = fStack_174 + fStack_4b4 * fVar2;
    o1[2] = local_178 + local_4b8 * fVar2;
    o0[1] = fStack_16c + fStack_4ac * fVar2;
    o0[0] = fStack_170 + fStack_4b0 * fVar2;
    local_198 = (float)*(undefined8 *)(pfStack_d78 + 4);
    fStack_194 = (float)((ulong)*(undefined8 *)(pfStack_d78 + 4) >> 0x20);
    fStack_190 = (float)*(undefined8 *)(pfStack_d78 + 6);
    fStack_18c = (float)((ulong)*(undefined8 *)(pfStack_d78 + 6) >> 0x20);
    o2[3] = fStack_194 + fStack_4d4 * fVar2;
    o2[2] = local_198 + local_4d8 * fVar2;
    o1[1] = fStack_18c + fStack_4cc * fVar2;
    o1[0] = fStack_190 + fStack_4d0 * fVar2;
    local_1b8 = (float)*(undefined8 *)(pfStack_d78 + 8);
    fStack_1b4 = (float)((ulong)*(undefined8 *)(pfStack_d78 + 8) >> 0x20);
    fStack_1b0 = (float)*(undefined8 *)(pfStack_d78 + 10);
    fStack_1ac = (float)((ulong)*(undefined8 *)(pfStack_d78 + 10) >> 0x20);
    o3[3] = fStack_1b4 + fStack_4f4 * fVar2;
    o3[2] = local_1b8 + local_4f8 * fVar2;
    o2[1] = fStack_1ac + fStack_4ec * fVar2;
    o2[0] = fStack_1b0 + fStack_4f0 * fVar2;
    local_1d8 = (float)*(undefined8 *)(pfStack_d78 + 0xc);
    fStack_1d4 = (float)((ulong)*(undefined8 *)(pfStack_d78 + 0xc) >> 0x20);
    fStack_1d0 = (float)*(undefined8 *)(pfStack_d78 + 0xe);
    fStack_1cc = (float)((ulong)*(undefined8 *)(pfStack_d78 + 0xe) >> 0x20);
    r0[3] = fStack_1d4 + fStack_514 * fVar2;
    r0[2] = local_1d8 + local_518 * fVar2;
    o3[1] = fStack_1cc + fStack_50c * fVar2;
    o3[0] = fStack_1d0 + fStack_510 * fVar2;
    *(undefined8 *)pfStack_d78 = o1._8_8_;
    *(undefined8 *)(pfStack_d78 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_d78 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_d78 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_d78 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_d78 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_d78 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_d78 + 0xe) = o3._0_8_;
    local_1f8 = (float)*(undefined8 *)pfStack_d88;
    fStack_1f4 = (float)((ulong)*(undefined8 *)pfStack_d88 >> 0x20);
    fStack_1f0 = (float)*(undefined8 *)(pfStack_d88 + 2);
    fStack_1ec = (float)((ulong)*(undefined8 *)(pfStack_d88 + 2) >> 0x20);
    o1[3] = fStack_1f4 + fStack_4b4 * fVar3;
    o1[2] = local_1f8 + local_4b8 * fVar3;
    o0[1] = fStack_1ec + fStack_4ac * fVar3;
    o0[0] = fStack_1f0 + fStack_4b0 * fVar3;
    local_218 = (float)*(undefined8 *)(pfStack_d88 + 4);
    fStack_214 = (float)((ulong)*(undefined8 *)(pfStack_d88 + 4) >> 0x20);
    fStack_210 = (float)*(undefined8 *)(pfStack_d88 + 6);
    fStack_20c = (float)((ulong)*(undefined8 *)(pfStack_d88 + 6) >> 0x20);
    o2[3] = fStack_214 + fStack_4d4 * fVar3;
    o2[2] = local_218 + local_4d8 * fVar3;
    o1[1] = fStack_20c + fStack_4cc * fVar3;
    o1[0] = fStack_210 + fStack_4d0 * fVar3;
    local_238 = (float)*(undefined8 *)(pfStack_d88 + 8);
    fStack_234 = (float)((ulong)*(undefined8 *)(pfStack_d88 + 8) >> 0x20);
    fStack_230 = (float)*(undefined8 *)(pfStack_d88 + 10);
    fStack_22c = (float)((ulong)*(undefined8 *)(pfStack_d88 + 10) >> 0x20);
    o3[3] = fStack_234 + fStack_4f4 * fVar3;
    o3[2] = local_238 + local_4f8 * fVar3;
    o2[1] = fStack_22c + fStack_4ec * fVar3;
    o2[0] = fStack_230 + fStack_4f0 * fVar3;
    local_258 = (float)*(undefined8 *)(pfStack_d88 + 0xc);
    fStack_254 = (float)((ulong)*(undefined8 *)(pfStack_d88 + 0xc) >> 0x20);
    fStack_250 = (float)*(undefined8 *)(pfStack_d88 + 0xe);
    fStack_24c = (float)((ulong)*(undefined8 *)(pfStack_d88 + 0xe) >> 0x20);
    r0[3] = fStack_254 + fStack_514 * fVar3;
    r0[2] = local_258 + local_518 * fVar3;
    o3[1] = fStack_24c + fStack_50c * fVar3;
    o3[0] = fStack_250 + fStack_510 * fVar3;
    *(undefined8 *)pfStack_d88 = o1._8_8_;
    *(undefined8 *)(pfStack_d88 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_d88 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_d88 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_d88 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_d88 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_d88 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_d88 + 0xe) = o3._0_8_;
    local_278 = (float)*(undefined8 *)pfStack_d98;
    fStack_274 = (float)((ulong)*(undefined8 *)pfStack_d98 >> 0x20);
    fStack_270 = (float)*(undefined8 *)(pfStack_d98 + 2);
    fStack_26c = (float)((ulong)*(undefined8 *)(pfStack_d98 + 2) >> 0x20);
    o1[3] = fStack_274 + fStack_4b4 * fVar4;
    o1[2] = local_278 + local_4b8 * fVar4;
    o0[1] = fStack_26c + fStack_4ac * fVar4;
    o0[0] = fStack_270 + fStack_4b0 * fVar4;
    local_298 = (float)*(undefined8 *)(pfStack_d98 + 4);
    fStack_294 = (float)((ulong)*(undefined8 *)(pfStack_d98 + 4) >> 0x20);
    fStack_290 = (float)*(undefined8 *)(pfStack_d98 + 6);
    fStack_28c = (float)((ulong)*(undefined8 *)(pfStack_d98 + 6) >> 0x20);
    o2[3] = fStack_294 + fStack_4d4 * fVar4;
    o2[2] = local_298 + local_4d8 * fVar4;
    o1[1] = fStack_28c + fStack_4cc * fVar4;
    o1[0] = fStack_290 + fStack_4d0 * fVar4;
    local_2b8 = (float)*(undefined8 *)(pfStack_d98 + 8);
    fStack_2b4 = (float)((ulong)*(undefined8 *)(pfStack_d98 + 8) >> 0x20);
    fStack_2b0 = (float)*(undefined8 *)(pfStack_d98 + 10);
    fStack_2ac = (float)((ulong)*(undefined8 *)(pfStack_d98 + 10) >> 0x20);
    o3[3] = fStack_2b4 + fStack_4f4 * fVar4;
    o3[2] = local_2b8 + local_4f8 * fVar4;
    o2[1] = fStack_2ac + fStack_4ec * fVar4;
    o2[0] = fStack_2b0 + fStack_4f0 * fVar4;
    local_2d8 = (float)*(undefined8 *)(pfStack_d98 + 0xc);
    fStack_2d4 = (float)((ulong)*(undefined8 *)(pfStack_d98 + 0xc) >> 0x20);
    fStack_2d0 = (float)*(undefined8 *)(pfStack_d98 + 0xe);
    fStack_2cc = (float)((ulong)*(undefined8 *)(pfStack_d98 + 0xe) >> 0x20);
    r0[3] = fStack_2d4 + fStack_514 * fVar4;
    r0[2] = local_2d8 + local_518 * fVar4;
    o3[1] = fStack_2cc + fStack_50c * fVar4;
    o3[0] = fStack_2d0 + fStack_510 * fVar4;
    *(undefined8 *)pfStack_d98 = o1._8_8_;
    *(undefined8 *)(pfStack_d98 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_d98 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_d98 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_d98 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_d98 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_d98 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_d98 + 0xe) = o3._0_8_;
    local_2f8 = (float)*(undefined8 *)pfStack_da8;
    fStack_2f4 = (float)((ulong)*(undefined8 *)pfStack_da8 >> 0x20);
    fStack_2f0 = (float)*(undefined8 *)(pfStack_da8 + 2);
    fStack_2ec = (float)((ulong)*(undefined8 *)(pfStack_da8 + 2) >> 0x20);
    o1[3] = fStack_2f4 + fStack_4b4 * fVar5;
    o1[2] = local_2f8 + local_4b8 * fVar5;
    o0[1] = fStack_2ec + fStack_4ac * fVar5;
    o0[0] = fStack_2f0 + fStack_4b0 * fVar5;
    local_318 = (float)*(undefined8 *)(pfStack_da8 + 4);
    fStack_314 = (float)((ulong)*(undefined8 *)(pfStack_da8 + 4) >> 0x20);
    fStack_310 = (float)*(undefined8 *)(pfStack_da8 + 6);
    fStack_30c = (float)((ulong)*(undefined8 *)(pfStack_da8 + 6) >> 0x20);
    o2[3] = fStack_314 + fStack_4d4 * fVar5;
    o2[2] = local_318 + local_4d8 * fVar5;
    o1[1] = fStack_30c + fStack_4cc * fVar5;
    o1[0] = fStack_310 + fStack_4d0 * fVar5;
    local_338 = (float)*(undefined8 *)(pfStack_da8 + 8);
    fStack_334 = (float)((ulong)*(undefined8 *)(pfStack_da8 + 8) >> 0x20);
    fStack_330 = (float)*(undefined8 *)(pfStack_da8 + 10);
    fStack_32c = (float)((ulong)*(undefined8 *)(pfStack_da8 + 10) >> 0x20);
    o3[3] = fStack_334 + fStack_4f4 * fVar5;
    o3[2] = local_338 + local_4f8 * fVar5;
    o2[1] = fStack_32c + fStack_4ec * fVar5;
    o2[0] = fStack_330 + fStack_4f0 * fVar5;
    local_358 = (float)*(undefined8 *)(pfStack_da8 + 0xc);
    fStack_354 = (float)((ulong)*(undefined8 *)(pfStack_da8 + 0xc) >> 0x20);
    fStack_350 = (float)*(undefined8 *)(pfStack_da8 + 0xe);
    fStack_34c = (float)((ulong)*(undefined8 *)(pfStack_da8 + 0xe) >> 0x20);
    r0[3] = fStack_354 + fStack_514 * fVar5;
    r0[2] = local_358 + local_518 * fVar5;
    o3[1] = fStack_34c + fStack_50c * fVar5;
    o3[0] = fStack_350 + fStack_510 * fVar5;
    *(undefined8 *)pfStack_da8 = o1._8_8_;
    *(undefined8 *)(pfStack_da8 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_da8 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_da8 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_da8 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_da8 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_da8 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_da8 + 0xe) = o3._0_8_;
    local_378 = (float)*(undefined8 *)pfStack_db8;
    fStack_374 = (float)((ulong)*(undefined8 *)pfStack_db8 >> 0x20);
    fStack_370 = (float)*(undefined8 *)(pfStack_db8 + 2);
    fStack_36c = (float)((ulong)*(undefined8 *)(pfStack_db8 + 2) >> 0x20);
    o1[3] = fStack_374 + fStack_4b4 * fVar6;
    o1[2] = local_378 + local_4b8 * fVar6;
    o0[1] = fStack_36c + fStack_4ac * fVar6;
    o0[0] = fStack_370 + fStack_4b0 * fVar6;
    local_398 = (float)*(undefined8 *)(pfStack_db8 + 4);
    fStack_394 = (float)((ulong)*(undefined8 *)(pfStack_db8 + 4) >> 0x20);
    fStack_390 = (float)*(undefined8 *)(pfStack_db8 + 6);
    fStack_38c = (float)((ulong)*(undefined8 *)(pfStack_db8 + 6) >> 0x20);
    o2[3] = fStack_394 + fStack_4d4 * fVar6;
    o2[2] = local_398 + local_4d8 * fVar6;
    o1[1] = fStack_38c + fStack_4cc * fVar6;
    o1[0] = fStack_390 + fStack_4d0 * fVar6;
    local_3b8 = (float)*(undefined8 *)(pfStack_db8 + 8);
    fStack_3b4 = (float)((ulong)*(undefined8 *)(pfStack_db8 + 8) >> 0x20);
    fStack_3b0 = (float)*(undefined8 *)(pfStack_db8 + 10);
    fStack_3ac = (float)((ulong)*(undefined8 *)(pfStack_db8 + 10) >> 0x20);
    o3[3] = fStack_3b4 + fStack_4f4 * fVar6;
    o3[2] = local_3b8 + local_4f8 * fVar6;
    o2[1] = fStack_3ac + fStack_4ec * fVar6;
    o2[0] = fStack_3b0 + fStack_4f0 * fVar6;
    local_3d8 = (float)*(undefined8 *)(pfStack_db8 + 0xc);
    fStack_3d4 = (float)((ulong)*(undefined8 *)(pfStack_db8 + 0xc) >> 0x20);
    fStack_3d0 = (float)*(undefined8 *)(pfStack_db8 + 0xe);
    fStack_3cc = (float)((ulong)*(undefined8 *)(pfStack_db8 + 0xe) >> 0x20);
    r0[3] = fStack_3d4 + fStack_514 * fVar6;
    r0[2] = local_3d8 + local_518 * fVar6;
    o3[1] = fStack_3cc + fStack_50c * fVar6;
    o3[0] = fStack_3d0 + fStack_510 * fVar6;
    *(undefined8 *)pfStack_db8 = o1._8_8_;
    *(undefined8 *)(pfStack_db8 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_db8 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_db8 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_db8 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_db8 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_db8 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_db8 + 0xe) = o3._0_8_;
    pfStack_d68 = pfStack_d68 + 0x10;
    pfStack_d78 = pfStack_d78 + 0x10;
    pfStack_d88 = pfStack_d88 + 0x10;
    pfStack_d98 = pfStack_d98 + 0x10;
    pfStack_da8 = pfStack_da8 + 0x10;
    pfStack_db8 = pfStack_db8 + 0x10;
  }
  for (; 0xf < (long)input_end - (long)input_end_local; input_end_local = input_end_local + 4) {
    local_7b8 = (float)*(undefined8 *)input_end_local;
    fStack_7b4 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_7b0 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_7ac = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    local_3f8 = (float)*(undefined8 *)pfStack_d68;
    fStack_3f4 = (float)((ulong)*(undefined8 *)pfStack_d68 >> 0x20);
    fStack_3f0 = (float)*(undefined8 *)(pfStack_d68 + 2);
    fStack_3ec = (float)((ulong)*(undefined8 *)(pfStack_d68 + 2) >> 0x20);
    r0_1[3] = fStack_3f4 + fStack_7b4 * fVar1;
    r0_1[2] = local_3f8 + local_7b8 * fVar1;
    o0_1[1] = fStack_3ec + fStack_7ac * fVar1;
    o0_1[0] = fStack_3f0 + fStack_7b0 * fVar1;
    *(undefined8 *)pfStack_d68 = r0_1._8_8_;
    *(undefined8 *)(pfStack_d68 + 2) = o0_1._0_8_;
    local_418 = (float)*(undefined8 *)pfStack_d78;
    fStack_414 = (float)((ulong)*(undefined8 *)pfStack_d78 >> 0x20);
    fStack_410 = (float)*(undefined8 *)(pfStack_d78 + 2);
    fStack_40c = (float)((ulong)*(undefined8 *)(pfStack_d78 + 2) >> 0x20);
    r0_1[3] = fStack_414 + fStack_7b4 * fVar2;
    r0_1[2] = local_418 + local_7b8 * fVar2;
    o0_1[1] = fStack_40c + fStack_7ac * fVar2;
    o0_1[0] = fStack_410 + fStack_7b0 * fVar2;
    *(undefined8 *)pfStack_d78 = r0_1._8_8_;
    *(undefined8 *)(pfStack_d78 + 2) = o0_1._0_8_;
    local_438 = (float)*(undefined8 *)pfStack_d88;
    fStack_434 = (float)((ulong)*(undefined8 *)pfStack_d88 >> 0x20);
    fStack_430 = (float)*(undefined8 *)(pfStack_d88 + 2);
    fStack_42c = (float)((ulong)*(undefined8 *)(pfStack_d88 + 2) >> 0x20);
    r0_1[3] = fStack_434 + fStack_7b4 * fVar3;
    r0_1[2] = local_438 + local_7b8 * fVar3;
    o0_1[1] = fStack_42c + fStack_7ac * fVar3;
    o0_1[0] = fStack_430 + fStack_7b0 * fVar3;
    *(undefined8 *)pfStack_d88 = r0_1._8_8_;
    *(undefined8 *)(pfStack_d88 + 2) = o0_1._0_8_;
    local_458 = (float)*(undefined8 *)pfStack_d98;
    fStack_454 = (float)((ulong)*(undefined8 *)pfStack_d98 >> 0x20);
    fStack_450 = (float)*(undefined8 *)(pfStack_d98 + 2);
    fStack_44c = (float)((ulong)*(undefined8 *)(pfStack_d98 + 2) >> 0x20);
    r0_1[3] = fStack_454 + fStack_7b4 * fVar4;
    r0_1[2] = local_458 + local_7b8 * fVar4;
    o0_1[1] = fStack_44c + fStack_7ac * fVar4;
    o0_1[0] = fStack_450 + fStack_7b0 * fVar4;
    *(undefined8 *)pfStack_d98 = r0_1._8_8_;
    *(undefined8 *)(pfStack_d98 + 2) = o0_1._0_8_;
    local_478 = (float)*(undefined8 *)pfStack_da8;
    fStack_474 = (float)((ulong)*(undefined8 *)pfStack_da8 >> 0x20);
    fStack_470 = (float)*(undefined8 *)(pfStack_da8 + 2);
    fStack_46c = (float)((ulong)*(undefined8 *)(pfStack_da8 + 2) >> 0x20);
    r0_1[3] = fStack_474 + fStack_7b4 * fVar5;
    r0_1[2] = local_478 + local_7b8 * fVar5;
    o0_1[1] = fStack_46c + fStack_7ac * fVar5;
    o0_1[0] = fStack_470 + fStack_7b0 * fVar5;
    *(undefined8 *)pfStack_da8 = r0_1._8_8_;
    *(undefined8 *)(pfStack_da8 + 2) = o0_1._0_8_;
    local_498 = (float)*(undefined8 *)pfStack_db8;
    fStack_494 = (float)((ulong)*(undefined8 *)pfStack_db8 >> 0x20);
    fStack_490 = (float)*(undefined8 *)(pfStack_db8 + 2);
    fStack_48c = (float)((ulong)*(undefined8 *)(pfStack_db8 + 2) >> 0x20);
    r0_1[3] = fStack_494 + fStack_7b4 * fVar6;
    r0_1[2] = local_498 + local_7b8 * fVar6;
    o0_1[1] = fStack_48c + fStack_7ac * fVar6;
    o0_1[0] = fStack_490 + fStack_7b0 * fVar6;
    *(undefined8 *)pfStack_db8 = r0_1._8_8_;
    *(undefined8 *)(pfStack_db8 + 2) = o0_1._0_8_;
    pfStack_d68 = pfStack_d68 + 4;
    pfStack_d78 = pfStack_d78 + 4;
    pfStack_d88 = pfStack_d88 + 4;
    pfStack_d98 = pfStack_d98 + 4;
    pfStack_da8 = pfStack_da8 + 4;
    pfStack_db8 = pfStack_db8 + 4;
  }
  for (; input_end_local < input_end; input_end_local = input_end_local + 1) {
    fVar7 = *input_end_local;
    *pfStack_d68 = fVar7 * fVar1 + *pfStack_d68;
    *pfStack_d78 = fVar7 * fVar2 + *pfStack_d78;
    *pfStack_d88 = fVar7 * fVar3 + *pfStack_d88;
    *pfStack_d98 = fVar7 * fVar4 + *pfStack_d98;
    *pfStack_da8 = fVar7 * fVar5 + *pfStack_da8;
    *pfStack_db8 = fVar7 * fVar6 + *pfStack_db8;
    pfStack_d68 = pfStack_d68 + 1;
    pfStack_d78 = pfStack_d78 + 1;
    pfStack_d88 = pfStack_d88 + 1;
    pfStack_d98 = pfStack_d98 + 1;
    pfStack_da8 = pfStack_da8 + 1;
    pfStack_db8 = pfStack_db8 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_scatter_with_,_coeffs)( float ** outputs, float const * vertical_coefficients, float const * input, float const * input_end )
{
  stbIF0( float STBIR_SIMD_STREAMOUT_PTR( * ) output0 = outputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float STBIR_SIMD_STREAMOUT_PTR( * ) output1 = outputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float STBIR_SIMD_STREAMOUT_PTR( * ) output2 = outputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float STBIR_SIMD_STREAMOUT_PTR( * ) output3 = outputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float STBIR_SIMD_STREAMOUT_PTR( * ) output4 = outputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float STBIR_SIMD_STREAMOUT_PTR( * ) output5 = outputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float STBIR_SIMD_STREAMOUT_PTR( * ) output6 = outputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float STBIR_SIMD_STREAMOUT_PTR( * ) output7 = outputs[7]; float c7s = vertical_coefficients[7]; )

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdfX_load( r0, input );               stbir__simdfX_load( r1, input+stbir__simdfX_float_count );     stbir__simdfX_load( r2, input+(2*stbir__simdfX_float_count) );      stbir__simdfX_load( r3, input+(3*stbir__simdfX_float_count) );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output0 );     stbir__simdfX_load( o1, output0+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output0+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );  stbir__simdfX_madd( o2, o2, r2, c0 );   stbir__simdfX_madd( o3, o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_load( o0, output1 );     stbir__simdfX_load( o1, output1+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output1+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );  stbir__simdfX_madd( o2, o2, r2, c1 );   stbir__simdfX_madd( o3, o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_load( o0, output2 );     stbir__simdfX_load( o1, output2+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output2+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );  stbir__simdfX_madd( o2, o2, r2, c2 );   stbir__simdfX_madd( o3, o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_load( o0, output3 );     stbir__simdfX_load( o1, output3+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output3+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );  stbir__simdfX_madd( o2, o2, r2, c3 );   stbir__simdfX_madd( o3, o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_load( o0, output4 );     stbir__simdfX_load( o1, output4+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output4+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );  stbir__simdfX_madd( o2, o2, r2, c4 );   stbir__simdfX_madd( o3, o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_load( o0, output5 );     stbir__simdfX_load( o1, output5+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output5+(2*stbir__simdfX_float_count));    stbir__simdfX_load( o3, output5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );  stbir__simdfX_madd( o2, o2, r2, c5 );   stbir__simdfX_madd( o3, o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_load( o0, output6 );     stbir__simdfX_load( o1, output6+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output6+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );  stbir__simdfX_madd( o2, o2, r2, c6 );   stbir__simdfX_madd( o3, o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_load( o0, output7 );     stbir__simdfX_load( o1, output7+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output7+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );  stbir__simdfX_madd( o2, o2, r2, c7 );   stbir__simdfX_madd( o3, o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #else
      stbIF0( stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );      stbir__simdfX_mult( o2, r2, c0 );       stbir__simdfX_mult( o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_mult( o0, r0, c1 );      stbir__simdfX_mult( o1, r1, c1 );      stbir__simdfX_mult( o2, r2, c1 );       stbir__simdfX_mult( o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_mult( o0, r0, c2 );      stbir__simdfX_mult( o1, r1, c2 );      stbir__simdfX_mult( o2, r2, c2 );       stbir__simdfX_mult( o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_mult( o0, r0, c3 );      stbir__simdfX_mult( o1, r1, c3 );      stbir__simdfX_mult( o2, r2, c3 );       stbir__simdfX_mult( o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_mult( o0, r0, c4 );      stbir__simdfX_mult( o1, r1, c4 );      stbir__simdfX_mult( o2, r2, c4 );       stbir__simdfX_mult( o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_mult( o0, r0, c5 );      stbir__simdfX_mult( o1, r1, c5 );      stbir__simdfX_mult( o2, r2, c5 );       stbir__simdfX_mult( o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_mult( o0, r0, c6 );      stbir__simdfX_mult( o1, r1, c6 );      stbir__simdfX_mult( o2, r2, c6 );       stbir__simdfX_mult( o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_mult( o0, r0, c7 );      stbir__simdfX_mult( o1, r1, c7 );      stbir__simdfX_mult( o2, r2, c7 );       stbir__simdfX_mult( o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #endif

      input += (4*stbir__simdfX_float_count);
      stbIF0( output0 += (4*stbir__simdfX_float_count); ) stbIF1( output1 += (4*stbir__simdfX_float_count); ) stbIF2( output2 += (4*stbir__simdfX_float_count); ) stbIF3( output3 += (4*stbir__simdfX_float_count); ) stbIF4( output4 += (4*stbir__simdfX_float_count); ) stbIF5( output5 += (4*stbir__simdfX_float_count); ) stbIF6( output6 += (4*stbir__simdfX_float_count); ) stbIF7( output7 += (4*stbir__simdfX_float_count); )
    }
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdf_load( r0, input );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output0 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );  stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_load( o0, output1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );  stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_load( o0, output2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );  stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_load( o0, output3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );  stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_load( o0, output4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );  stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_load( o0, output5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );  stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_load( o0, output6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );  stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_load( o0, output7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );  stbir__simdf_store( output7, o0 ); )
      #else
      stbIF0( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );   stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );   stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );   stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );   stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );   stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );   stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );   stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );   stbir__simdf_store( output7, o0 ); )
      #endif

      input += 4;
      stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input_end - (char*) input ) >= 16 )
  {
    float r0, r1, r2, r3;
    STBIR_NO_UNROLL(input);

    r0 = input[0], r1 = input[1], r2 = input[2], r3 = input[3];

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r0 * c0s ); output0[1] += ( r1 * c0s ); output0[2] += ( r2 * c0s ); output0[3] += ( r3 * c0s ); )
    stbIF1( output1[0] += ( r0 * c1s ); output1[1] += ( r1 * c1s ); output1[2] += ( r2 * c1s ); output1[3] += ( r3 * c1s ); )
    stbIF2( output2[0] += ( r0 * c2s ); output2[1] += ( r1 * c2s ); output2[2] += ( r2 * c2s ); output2[3] += ( r3 * c2s ); )
    stbIF3( output3[0] += ( r0 * c3s ); output3[1] += ( r1 * c3s ); output3[2] += ( r2 * c3s ); output3[3] += ( r3 * c3s ); )
    stbIF4( output4[0] += ( r0 * c4s ); output4[1] += ( r1 * c4s ); output4[2] += ( r2 * c4s ); output4[3] += ( r3 * c4s ); )
    stbIF5( output5[0] += ( r0 * c5s ); output5[1] += ( r1 * c5s ); output5[2] += ( r2 * c5s ); output5[3] += ( r3 * c5s ); )
    stbIF6( output6[0] += ( r0 * c6s ); output6[1] += ( r1 * c6s ); output6[2] += ( r2 * c6s ); output6[3] += ( r3 * c6s ); )
    stbIF7( output7[0] += ( r0 * c7s ); output7[1] += ( r1 * c7s ); output7[2] += ( r2 * c7s ); output7[3] += ( r3 * c7s ); )
    #else
    stbIF0( output0[0]  = ( r0 * c0s ); output0[1]  = ( r1 * c0s ); output0[2]  = ( r2 * c0s ); output0[3]  = ( r3 * c0s ); )
    stbIF1( output1[0]  = ( r0 * c1s ); output1[1]  = ( r1 * c1s ); output1[2]  = ( r2 * c1s ); output1[3]  = ( r3 * c1s ); )
    stbIF2( output2[0]  = ( r0 * c2s ); output2[1]  = ( r1 * c2s ); output2[2]  = ( r2 * c2s ); output2[3]  = ( r3 * c2s ); )
    stbIF3( output3[0]  = ( r0 * c3s ); output3[1]  = ( r1 * c3s ); output3[2]  = ( r2 * c3s ); output3[3]  = ( r3 * c3s ); )
    stbIF4( output4[0]  = ( r0 * c4s ); output4[1]  = ( r1 * c4s ); output4[2]  = ( r2 * c4s ); output4[3]  = ( r3 * c4s ); )
    stbIF5( output5[0]  = ( r0 * c5s ); output5[1]  = ( r1 * c5s ); output5[2]  = ( r2 * c5s ); output5[3]  = ( r3 * c5s ); )
    stbIF6( output6[0]  = ( r0 * c6s ); output6[1]  = ( r1 * c6s ); output6[2]  = ( r2 * c6s ); output6[3]  = ( r3 * c6s ); )
    stbIF7( output7[0]  = ( r0 * c7s ); output7[1]  = ( r1 * c7s ); output7[2]  = ( r2 * c7s ); output7[3]  = ( r3 * c7s ); )
    #endif

    input += 4;
    stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input < input_end )
  {
    float r = input[0];
    STBIR_NO_UNROLL(output0);

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r * c0s ); )
    stbIF1( output1[0] += ( r * c1s ); )
    stbIF2( output2[0] += ( r * c2s ); )
    stbIF3( output3[0] += ( r * c3s ); )
    stbIF4( output4[0] += ( r * c4s ); )
    stbIF5( output5[0] += ( r * c5s ); )
    stbIF6( output6[0] += ( r * c6s ); )
    stbIF7( output7[0] += ( r * c7s ); )
    #else
    stbIF0( output0[0]  = ( r * c0s ); )
    stbIF1( output1[0]  = ( r * c1s ); )
    stbIF2( output2[0]  = ( r * c2s ); )
    stbIF3( output3[0]  = ( r * c3s ); )
    stbIF4( output4[0]  = ( r * c4s ); )
    stbIF5( output5[0]  = ( r * c5s ); )
    stbIF6( output6[0]  = ( r * c6s ); )
    stbIF7( output7[0]  = ( r * c7s ); )
    #endif

    ++input;
    stbIF0( ++output0; ) stbIF1( ++output1; ) stbIF2( ++output2; ) stbIF3( ++output3; ) stbIF4( ++output4; ) stbIF5( ++output5; ) stbIF6( ++output6; ) stbIF7( ++output7; )
  }
}